

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s3_align.c
# Opt level: O0

void build_succ_ci(s3wid_t w,int32 append_filler,s3cipid_t *succ_ci)

{
  int local_20;
  int local_1c;
  int32 p;
  int32 i;
  s3cipid_t *succ_ci_local;
  int32 append_filler_local;
  s3wid_t w_local;
  
  for (local_20 = 0; succ_ci_local._4_4_ = w, local_20 < mdef->n_ciphone; local_20 = local_20 + 1) {
    succ_ci[local_20] = 0;
  }
  for (; -1 < succ_ci_local._4_4_; succ_ci_local._4_4_ = dict->word[succ_ci_local._4_4_].alt) {
    succ_ci[(uint)(int)*dict->word[succ_ci_local._4_4_].ciphone] = 1;
  }
  if (append_filler != 0) {
    for (local_1c = 0; -1 < fillwid[local_1c]; local_1c = local_1c + 1) {
      for (succ_ci_local._4_4_ = fillwid[local_1c]; -1 < succ_ci_local._4_4_;
          succ_ci_local._4_4_ = dict->word[succ_ci_local._4_4_].alt) {
        succ_ci[(uint)(int)*dict->word[succ_ci_local._4_4_].ciphone] = 1;
      }
    }
  }
  local_1c = 0;
  for (local_20 = 0; local_20 < mdef->n_ciphone; local_20 = local_20 + 1) {
    if (succ_ci[local_20] != 0) {
      succ_ci[local_1c] = (s3cipid_t)local_20;
      local_1c = local_1c + 1;
    }
  }
  succ_ci[local_1c] = -1;
  return;
}

Assistant:

static void
build_succ_ci(s3wid_t w, int32 append_filler, s3cipid_t * succ_ci)
{
    int32 i, p;

    for (p = 0; p < mdef->n_ciphone; p++)
        succ_ci[p] = 0;

    for (; IS_S3WID(w); w = dict->word[w].alt)
        succ_ci[(unsigned) dict->word[w].ciphone[0]] = 1;

    if (append_filler) {
        for (i = 0; IS_S3WID(fillwid[i]); i++)
            for (w = fillwid[i]; IS_S3WID(w); w = dict->word[w].alt)
                succ_ci[(unsigned) dict->word[w].ciphone[0]] = 1;
    }

    i = 0;
    for (p = 0; p < mdef->n_ciphone; p++) {
        if (succ_ci[p])
            succ_ci[i++] = p;
    }
    succ_ci[i] = BAD_S3CIPID;
}